

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool find_solution(int step,int R,int G,int L,int S,int X,bool jumped,
                  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *solution)

{
  int iVar1;
  bool bVar2;
  ostream *poVar3;
  undefined4 in_register_0000000c;
  undefined8 uVar4;
  char *pcVar5;
  undefined4 in_register_0000003c;
  undefined8 uVar6;
  int iVar7;
  ulong uVar8;
  value_type local_70;
  undefined8 local_50;
  ulong local_48;
  undefined8 local_40;
  allocator<char> local_31;
  
  uVar6 = CONCAT44(in_register_0000003c,step);
  uVar4 = CONCAT44(in_register_0000000c,L);
  iVar1 = G + R;
  if ((X < iVar1 && R <= X) || (S < 0 || L + iVar1 <= X)) {
LAB_0010233f:
    bVar2 = false;
  }
  else {
    if ((S == 0) && ((iVar1 < X && (jumped)))) {
      return true;
    }
    uVar8 = (ulong)jumped;
    if (((G + 1 < S && S != 0 || jumped) && (iVar7 = X + S + -1, R <= X || iVar7 <= iVar1)) &&
       (local_50 = uVar4, local_48 = uVar8, local_40 = uVar6,
       bVar2 = find_solution(step + 1,R,G,L,S + -1,iVar7,jumped,solution), uVar4 = local_50,
       uVar6 = local_40, uVar8 = local_48, bVar2)) {
      pcVar5 = "SLOW";
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"SLOW",&local_31);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_front(solution,&local_70);
    }
    else if (((S == 0) || (iVar1 <= X + S && X < R)) ||
            (local_50 = uVar4, local_48 = uVar8, local_40 = uVar6,
            bVar2 = find_solution((int)uVar6 + 1,R,G,(int)uVar4,S,X + S,SUB81(uVar8,0),solution),
            uVar4 = local_50, uVar6 = local_40, uVar8 = local_48, !bVar2)) {
      if (((G < S) || (iVar7 = X + S + 1, X < R && iVar1 <= iVar7)) ||
         (local_40 = uVar6,
         bVar2 = find_solution((int)uVar6 + 1,R,G,(int)uVar4,S + 1,iVar7,SUB81(uVar8,0),solution),
         uVar6 = local_40, !bVar2)) {
        if ((R + -1 != X || S == 0) ||
           (bVar2 = find_solution((int)uVar6 + 1,R,G,(int)uVar4,S,X + S,true,solution), !bVar2))
        goto LAB_0010233f;
        pcVar5 = "JUMP";
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"JUMP",&local_31);
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_front(solution,&local_70);
      }
      else {
        pcVar5 = "SPEED";
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"SPEED",&local_31);
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_front(solution,&local_70);
      }
    }
    else {
      pcVar5 = "WAIT";
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"WAIT",&local_31);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_front(solution,&local_70);
    }
    std::__cxx11::string::~string((string *)&local_70);
    poVar3 = std::operator<<((ostream *)&std::cerr,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar3);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool find_solution(int step, int R, int G, int L, int S, int X, bool jumped, std::list<std::string>& solution)
{
    //pad(step);
    //std::cerr << "step #" << step + 1 << std::endl;

    if ((X < R + G && X >= R)   // In down
        || X >= R + G + L       // Out of range
        || S < 0)               // Speed is negative
    {
        return false;
    }
    if (0 == S && R + G + L > X && X > R + G && jumped)
    {
        return true;
    }

    if (((0 < S && G + 1 < S) || jumped)
            && !(X < R && X + S - 1 > R + G))
    {
        //pad(step);
        //std::cerr << "Try SLOW: R == " << R << "; G == " << G << "; L == " << L << "; S == " << S << "; X == " << X << "; " << (jumped ? "already jumped" : "not jumped yet") << std::endl;
        if (find_solution(step + 1, R, G, L, S - 1, X + S - 1, jumped, solution))
        {
            solution.push_front("SLOW");
            std::cerr << "SLOW" << std::endl;
            return true;
        }
    }
    if (0 != S
            && !(X < R && X + S >= R + G))
    {
        //pad(step);
        //std::cerr << "Try WAIT: R == " << R << "; G == " << G << "; L == " << L << "; S == " << S << "; X == " << X << "; " << (jumped ? "already jumped" : "not jumped yet") << std::endl;
        if (find_solution(step + 1, R, G, L, S, X + S, jumped, solution))
        {
            solution.push_front("WAIT");
            std::cerr << "WAIT" << std::endl;
            return true;
        }
    }
    if (G + 1 > S
            && !(X < R && X + S + 1 >= R + G))
    {
        //pad(step);
        //std::cerr << "Try SPEED: R == " << R << "; G == " << G << "; L == " << L << "; S == " << S << "; X == " << X << "; " << (jumped ? "already jumped" : "not jumped yet") << std::endl;
        if (find_solution(step + 1, R, G, L, S + 1, X + S + 1, jumped, solution))
        {
            solution.push_front("SPEED");
            std::cerr << "SPEED" << std::endl;
            return true;
        }
    }
    if (0 < S
            && R - 1 == X)      // Try JUMP
    {
        //pad(step);
        //std::cerr << "Try JUMP: R == " << R << "; G == " << G << "; L == " << L << "; S == " << S << "; X == " << X << "; " << (jumped ? "already jumped" : "not jumped yet") << std::endl;
        if (find_solution(step + 1, R, G, L, S, X + S, true, solution))
        {
            solution.push_front("JUMP");
            std::cerr << "JUMP" << std::endl;
            return true;
        }
    }
    return false;
}